

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spikeestimator.cxx
# Opt level: O0

int __thiscall SpikeEstimator::init(SpikeEstimator *this,EVP_PKEY_CTX *ctx)

{
  uint local_14;
  uint i;
  SpikeEstimator *this_local;
  
  this->spkALast = 0;
  this->spkBLast = 0;
  this->spkDiffAB = 0;
  this->spkDiffBA = 0;
  this->initA = false;
  this->initB = false;
  (this->super_Estimator).nSamples = 0;
  if (this->spkSample != (double *)0x0) {
    for (local_14 = 0; local_14 < this->spkLength; local_14 = local_14 + 1) {
      this->spkSample[local_14] = 0.0;
    }
  }
  this->spkOne = 0.0;
  return (int)this;
}

Assistant:

void SpikeEstimator::init()
{
    spkALast = 0;
    spkBLast = 0;
    spkDiffAB = 0;
    spkDiffBA = 0;
    initA = false;
    initB = false;

	nSamples = 0;
    if(spkSample)
        for(uint i=0; i<spkLength; i++)
            spkSample[i] = 0.0;
    spkOne = 0.0l;
}